

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<1,460>::ContinuousPhotons::
ContinuousPhotons<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ContinuousPhotons *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((ListRecord *)this,begin,end,lineNumber,MAT,MF,MT);
  Type<1,_460>::ContinuousPhotons::verifySize
            ((int)((ulong)(*(long *)(this + 0x38) - *(long *)(this + 0x30)) >> 3));
  return;
}

Assistant:

ContinuousPhotons( Iterator& begin, const Iterator& end,
                   long& lineNumber, int MAT, int MF, int MT )
  try : ListRecord( begin, end, lineNumber, MAT, MF, MT ) {

    verifySize( this->NNF() );
  }
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing continuous delayed photon "
               "data" );
    throw;
  }